

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_utils.cc
# Opt level: O1

vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *
discoverWithFilter(vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   *__return_storage_ptr__,DeviceFilter *filter)

{
  uint64_t uVar1;
  undefined8 uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pDVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  DeviceInfo *extraout_RDX;
  DeviceInfo *extraout_RDX_00;
  DeviceInfo *extraout_RDX_01;
  DeviceInfo *extraout_RDX_02;
  DeviceInfo *extraout_RDX_03;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  __it2;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *__range1;
  DeviceInfo *this;
  DeviceInfo *pDVar11;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  _Var12;
  DeviceInfo *info;
  iterator __first;
  pointer pDVar13;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> infos;
  Discover discover;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_78;
  Discover local_60;
  
  rcdiscover::Discover::Discover(&local_60);
  rcdiscover::Discover::broadcastRequest(&local_60);
  lVar8 = std::chrono::_V2::steady_clock::now();
  local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (DeviceInfo *)0x0;
  local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (DeviceInfo *)0x0;
  local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = lVar8;
  while ((bVar7 = rcdiscover::Discover::getResponse(&local_60,&local_78,100),
         pDVar13 = local_78.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
         pDVar6 = local_78.
                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start, bVar7 ||
         ((double)(lVar9 - lVar8) / 1000000.0 < 1000.0))) {
    lVar9 = std::chrono::_V2::steady_clock::now();
  }
  __it2._M_current = extraout_RDX;
  if (local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = (long)local_78.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 8;
    lVar9 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pDVar6,pDVar13);
    __it2._M_current = extraout_RDX_00;
  }
  __first._M_current =
       local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  _Var12._M_current =
       local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  this = __first._M_current;
  if (local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pDVar11 = _Var12._M_current;
      _Var12._M_current = pDVar11 + 1;
      this = __first._M_current;
      if (_Var12._M_current == __first._M_current) break;
      bVar7 = __gnu_cxx::__ops::_Iter_comp_iter<discoverWithFilter(DeviceFilter_const&)::$_0>::
              operator()(pDVar11,_Var12,__it2);
      __it2._M_current = extraout_RDX_01;
      this = pDVar11;
    } while (!bVar7);
  }
  if (this != __first._M_current) {
    _Var12._M_current = this + 2;
    for (; _Var12._M_current != __first._M_current; _Var12._M_current = _Var12._M_current + 1) {
      bVar7 = __gnu_cxx::__ops::_Iter_comp_iter<discoverWithFilter(DeviceFilter_const&)::$_0>::
              operator()(this,_Var12,__it2);
      __it2._M_current = extraout_RDX_02;
      pDVar11 = this;
      if (!bVar7) {
        pDVar11 = this + 1;
        std::__cxx11::string::operator=((string *)pDVar11,(string *)_Var12._M_current);
        iVar3 = (_Var12._M_current)->minor;
        uVar1 = (_Var12._M_current)->mac;
        uVar2 = *(undefined8 *)((long)&(_Var12._M_current)->mac + 4);
        uVar4 = (_Var12._M_current)->subnet;
        uVar5 = (_Var12._M_current)->gateway;
        this[1].major = (_Var12._M_current)->major;
        this[1].minor = iVar3;
        this[1].mac = uVar1;
        *(undefined8 *)((long)&this[1].mac + 4) = uVar2;
        this[1].subnet = uVar4;
        this[1].gateway = uVar5;
        std::__cxx11::string::operator=
                  ((string *)&this[1].manufacturer_name,
                   (string *)&(_Var12._M_current)->manufacturer_name);
        std::__cxx11::string::operator=
                  ((string *)&this[1].model_name,(string *)&(_Var12._M_current)->model_name);
        std::__cxx11::string::operator=
                  ((string *)&this[1].device_version,(string *)&(_Var12._M_current)->device_version)
        ;
        std::__cxx11::string::operator=
                  ((string *)&this[1].manufacturer_info,
                   (string *)&(_Var12._M_current)->manufacturer_info);
        std::__cxx11::string::operator=
                  ((string *)&this[1].serial_number,(string *)&(_Var12._M_current)->serial_number);
        std::__cxx11::string::operator=
                  ((string *)&this[1].user_name,(string *)&(_Var12._M_current)->user_name);
        __it2._M_current = extraout_RDX_03;
      }
      this = pDVar11;
    }
    __first._M_current = this + 1;
  }
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::_M_erase
            (&local_78,__first,
             (iterator)
             local_78.
             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pDVar6 = local_78.
           super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pDVar13 = local_78.
                 super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pDVar13 != pDVar6; pDVar13 = pDVar13 + 1
      ) {
    bVar7 = filterDevice(pDVar13,filter);
    if (bVar7) {
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
                (__return_storage_ptr__,pDVar13);
    }
  }
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(&local_78);
  rcdiscover::Discover::~Discover(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<rcdiscover::DeviceInfo> discoverWithFilter(
    const DeviceFilter &filter)
{
  rcdiscover::Discover discover;
  discover.broadcastRequest();

  std::chrono::steady_clock::time_point tstart=std::chrono::steady_clock::now();
  std::chrono::steady_clock::time_point tend=tstart;

  std::vector<rcdiscover::DeviceInfo> infos;
  while (discover.getResponse(infos, 100) ||
    std::chrono::duration<double, std::milli>(tend-tstart).count() < 1000)
  {
    tend=std::chrono::steady_clock::now();
  }

  std::sort(infos.begin(), infos.end());
  infos.erase(std::unique(infos.begin(), infos.end(),
                          [](const rcdiscover::DeviceInfo &lhs,
                             const rcdiscover::DeviceInfo &rhs)
                          {
                            return lhs.getMAC() == rhs.getMAC() &&
                                   lhs.getIfaceName() == rhs.getIfaceName();
                          }), infos.end());

  std::vector<rcdiscover::DeviceInfo> filtered_devices;
  for (const auto &info : infos)
  {
    if (filterDevice(info, filter))
    {
      filtered_devices.push_back(info);
    }
  }
  return filtered_devices;
}